

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::RBCOMVisitor::visit(RBCOMVisitor *this,RigidBody *rb)

{
  double *pdVar1;
  long lVar2;
  AtomInfo *pAVar3;
  AtomInfo *pAVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  long lVar5;
  undefined1 local_99;
  AtomInfo *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  undefined1 local_88 [40];
  value_type local_60;
  double local_50;
  double local_48;
  double dStack_40;
  
  lVar5 = (long)(rb->super_StuntDouble).localIndex_;
  lVar2 = *(long *)((long)&(((rb->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                           position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                   (rb->super_StuntDouble).storage_);
  pdVar1 = (double *)(lVar2 + lVar5 * 0x18);
  local_48 = *pdVar1;
  dStack_40 = pdVar1[1];
  local_50 = *(double *)(lVar2 + 0x10 + lVar5 * 0x18);
  local_98 = (AtomInfo *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::AtomInfo,std::allocator<OpenMD::AtomInfo>>
            (&_Stack_90,&local_98,(allocator<OpenMD::AtomInfo> *)&local_99);
  this_00._M_pi = _Stack_90._M_pi;
  pAVar3 = local_98;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98 = (AtomInfo *)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)pAVar3,0,(char *)(pAVar3->atomTypeName)._M_string_length,0x25fb0e);
  (pAVar3->pos).super_Vector<double,_3U>.data_[0] = local_48;
  (pAVar3->pos).super_Vector<double,_3U>.data_[1] = dStack_40;
  (pAVar3->pos).super_Vector<double,_3U>.data_[2] = local_50;
  (pAVar3->vec).super_Vector<double,_3U>.data_[0] = 0.0;
  (pAVar3->vec).super_Vector<double,_3U>.data_[1] = 0.0;
  (pAVar3->vec).super_Vector<double,_3U>.data_[2] = 0.0;
  local_98 = (AtomInfo *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
            (&_Stack_90,(AtomData **)&local_98,(allocator<OpenMD::AtomData> *)&local_99);
  this_01._M_pi = _Stack_90._M_pi;
  pAVar4 = local_98;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98 = (AtomInfo *)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ATOMDATA","");
  std::__cxx11::string::_M_assign((string *)&(pAVar4->atomTypeName)._M_string_length);
  if (local_98 != (AtomInfo *)local_88) {
    operator_delete(local_98,(ulong)(local_88._0_8_ + 1));
  }
  local_60.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pAVar3;
  local_60.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_00._M_pi;
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>::
  push_back((vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
             *)&pAVar4->pos,&local_60);
  if (local_60.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_88._24_8_ = pAVar4;
  local_88._32_8_ = this_01._M_pi;
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
    }
  }
  StuntDouble::addProperty
            (&rb->super_StuntDouble,(shared_ptr<OpenMD::GenericData> *)(local_88 + 0x18));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._32_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._32_8_);
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  return;
}

Assistant:

void RBCOMVisitor::visit(RigidBody* rb) {
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    Vector3d pos;
    pos = rb->getPos();

    atomInfo               = std::make_shared<AtomInfo>();
    atomInfo->atomTypeName = "X";
    atomInfo->pos[0]       = pos[0];
    atomInfo->pos[1]       = pos[1];
    atomInfo->pos[2]       = pos[2];
    atomInfo->vec[0]       = 0;
    atomInfo->vec[1]       = 0;
    atomInfo->vec[2]       = 0;

    atomData = std::make_shared<AtomData>();
    atomData->setID("ATOMDATA");
    atomData->addAtomInfo(atomInfo);

    rb->addProperty(atomData);
  }